

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

ArrayPtr<void_*const> __thiscall kj::getStackTrace(kj *this,ArrayPtr<void_*> space,uint ignoreCount)

{
  int iVar1;
  ExceptionCallback *pEVar2;
  void **ppvVar3;
  size_t sVar4;
  WiderType<Decay<unsigned_int>,_Decay<unsigned_long_&>_> start;
  uint local_7c;
  ArrayPtr<void_*> local_78;
  void **local_68;
  void **addr;
  void **__end1;
  void **__begin1;
  ArrayPtr<void_*> *local_40;
  ArrayPtr<void_*> *__range1;
  size_t size;
  undefined1 auStack_28 [4];
  uint ignoreCount_local;
  ArrayPtr<void_*> space_local;
  
  space_local.ptr = space.ptr;
  size._4_4_ = (int)space.size_;
  _auStack_28 = this;
  pEVar2 = getExceptionCallback();
  iVar1 = (*pEVar2->_vptr_ExceptionCallback[5])();
  if (iVar1 == 2) {
    ArrayPtr<void_*const>::ArrayPtr((ArrayPtr<void_*const> *)&space_local.size_,(void *)0x0);
  }
  else {
    ppvVar3 = ArrayPtr<void_*>::begin((ArrayPtr<void_*> *)auStack_28);
    sVar4 = ArrayPtr<void_*>::size((ArrayPtr<void_*> *)auStack_28);
    iVar1 = backtrace(ppvVar3,sVar4 & 0xffffffff);
    __range1 = (ArrayPtr<void_*> *)(long)iVar1;
    ___begin1 = ArrayPtr<void_*>::first((ArrayPtr<void_*> *)auStack_28,(size_t)__range1);
    local_40 = (ArrayPtr<void_*> *)&__begin1;
    __end1 = ArrayPtr<void_*>::begin(local_40);
    addr = ArrayPtr<void_*>::end(local_40);
    for (; __end1 != addr; __end1 = __end1 + 1) {
      local_68 = __end1;
      *__end1 = (void *)((long)*__end1 + -1);
    }
    local_7c = size._4_4_ + 1;
    start = min<unsigned_int,unsigned_long&>(&local_7c,(unsigned_long *)&__range1);
    local_78 = ArrayPtr<void_*>::slice((ArrayPtr<void_*> *)auStack_28,start,(size_t)__range1);
    join_0x00000010_0x00000000_ = ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_78);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

ArrayPtr<void* const> getStackTrace(ArrayPtr<void*> space, uint ignoreCount) {
  if (getExceptionCallback().stackTraceMode() == ExceptionCallback::StackTraceMode::NONE) {
    return nullptr;
  }

#if KJ_USE_WIN32_DBGHELP
  CONTEXT context;
  RtlCaptureContext(&context);
  return getStackTrace(space, ignoreCount, GetCurrentThread(), context);
#elif KJ_HAS_BACKTRACE
  size_t size = backtrace(space.begin(), space.size());
  for (auto& addr: space.first(size)) {
    // The addresses produced by backtrace() are return addresses, which means they point to the
    // instruction immediately after the call. Invoking addr2line on these can be confusing because
    // it often points to the next line. If the next instruction is inlined from another function,
    // the trace can be extra-confusing, since now it claims to be in a function that was not
    // actually on the call stack. If we subtract 1 from each address, though, we get a much more
    // reasonable trace. This may cause the addresses to be invalid instruction pointers if the
    // instructions were multi-byte, but it appears addr2line is able to cope with this.
    addr = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(addr) - 1);
  }
  return space.slice(kj::min(ignoreCount + 1, size), size);
#else
  return nullptr;
#endif
}